

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O2

int IDASetMaxNonlinIters(void *ida_mem,int maxcor)

{
  int iVar1;
  int error_code;
  undefined4 in_register_00000034;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    error_code = -0x14;
    iVar1 = 0x1e1;
  }
  else {
    if (*(long *)((long)ida_mem + 0x3d8) != 0) {
      iVar1 = SUNNonlinSolSetMaxIters
                        (*(long *)((long)ida_mem + 0x3d8),CONCAT44(in_register_00000034,maxcor));
      return iVar1;
    }
    msgfmt = "A memory request failed.";
    error_code = -0x15;
    iVar1 = 0x1ea;
  }
  IDAProcessError((IDAMem)0x0,error_code,iVar1,"IDASetMaxNonlinIters",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDASetMaxNonlinIters(void* ida_mem, int maxcor)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  /* check that the NLS is non-NULL */
  if (IDA_mem->NLS == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    return (IDA_MEM_FAIL);
  }

  return (SUNNonlinSolSetMaxIters(IDA_mem->NLS, maxcor));
}